

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setCurrencyPluralInfo(DecimalFormat *this,CurrencyPluralInfo *info)

{
  UBool UVar1;
  int iVar2;
  DecimalFormatProperties *pDVar3;
  undefined4 extraout_var;
  CurrencyPluralInfo *pCVar4;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  CurrencyPluralInfo *info_local;
  DecimalFormat *this_local;
  
  pCVar4 = info;
  pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  UVar1 = LocalPointerBase<icu_63::CurrencyPluralInfo>::isNull
                    ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)&pDVar3->currencyPluralInfo);
  if (UVar1 == '\0') {
    pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pCVar4 = LocalPointerBase<icu_63::CurrencyPluralInfo>::operator*
                       ((LocalPointerBase<icu_63::CurrencyPluralInfo> *)&pDVar3->currencyPluralInfo)
    ;
    CurrencyPluralInfo::operator=(pCVar4,info);
  }
  else {
    pDVar3 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    iVar2 = CurrencyPluralInfo::clone(info,(__fn *)pCVar4,__child_stack,in_ECX,in_R8);
    LocalPointer<icu_63::CurrencyPluralInfo>::adoptInstead
              (&(pDVar3->currencyPluralInfo).fPtr,(CurrencyPluralInfo *)CONCAT44(extraout_var,iVar2)
              );
  }
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setCurrencyPluralInfo(const CurrencyPluralInfo& info) {
    if (fields->properties->currencyPluralInfo.fPtr.isNull()) {
        fields->properties->currencyPluralInfo.fPtr.adoptInstead(info.clone());
    } else {
        *fields->properties->currencyPluralInfo.fPtr = info; // copy-assignment operator
    }
    touchNoError();
}